

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

void pybind11::detail::loader_life_support::add_patient(handle h)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  reference pp_Var4;
  value_type p_Var5;
  handle *this;
  PyObject *pPVar6;
  PyObject **ppPVar7;
  int result;
  value_type *list_ptr;
  vector<_object_*,_std::allocator<_object_*>_> *stack;
  char *in_stack_ffffffffffffffb8;
  vector<_object_*,_std::allocator<_object_*>_> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  handle local_8;
  
  get_internals();
  bVar1 = std::vector<_object_*,_std::allocator<_object_*>_>::empty
                    ((vector<_object_*,_std::allocator<_object_*>_> *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (bVar1) {
    uVar3 = __cxa_allocate_exception(0x10);
    cast_error::runtime_error((cast_error *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    __cxa_throw(uVar3,&cast_error::typeinfo,cast_error::~cast_error);
  }
  pp_Var4 = std::vector<_object_*,_std::allocator<_object_*>_>::back(in_stack_ffffffffffffffc0);
  if (*pp_Var4 == (value_type)0x0) {
    p_Var5 = (value_type)PyList_New(1);
    *pp_Var4 = p_Var5;
    if (*pp_Var4 == (value_type)0x0) {
      pybind11_fail((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    }
    this = pybind11::handle::inc_ref((handle *)in_stack_ffffffffffffffc0);
    pPVar6 = pybind11::handle::ptr(this);
    iVar2 = PyType_HasFeature((*pp_Var4)->ob_type,0x2000000);
    if (iVar2 == 0) {
      __assert_fail("PyList_Check(list_ptr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/amlucas[P]sdfTools/src/extern/pybind11/include/pybind11/detail/type_caster_base.h"
                    ,0x45,"static void pybind11::detail::loader_life_support::add_patient(handle)");
    }
    (((*pp_Var4)[1].ob_type)->ob_base).ob_base.ob_refcnt = (Py_ssize_t)pPVar6;
  }
  else {
    p_Var5 = *pp_Var4;
    ppPVar7 = pybind11::handle::ptr(&local_8);
    iVar2 = PyList_Append(p_Var5,*ppPVar7);
    if (iVar2 == -1) {
      pybind11_fail((char *)CONCAT44(0xffffffff,in_stack_ffffffffffffffd0));
    }
  }
  return;
}

Assistant:

PYBIND11_NOINLINE static void add_patient(handle h) {
        auto &stack = get_internals().loader_patient_stack;
        if (stack.empty())
            throw cast_error("When called outside a bound function, py::cast() cannot "
                             "do Python -> C++ conversions which require the creation "
                             "of temporary values");

        auto &list_ptr = stack.back();
        if (list_ptr == nullptr) {
            list_ptr = PyList_New(1);
            if (!list_ptr)
                pybind11_fail("loader_life_support: error allocating list");
            PyList_SET_ITEM(list_ptr, 0, h.inc_ref().ptr());
        } else {
            auto result = PyList_Append(list_ptr, h.ptr());
            if (result == -1)
                pybind11_fail("loader_life_support: error adding patient");
        }
    }